

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmResourceInfoCommon::CreateCustomRes_2
          (GmmResourceInfoCommon *this,Context *GmmLibContext,
          GMM_RESCREATE_CUSTOM_PARAMS_2 *CreateParams)

{
  uint8_t *puVar1;
  GMM_RESOURCE_TYPE GVar2;
  uint8_t uVar3;
  GMM_CLIENT GVar4;
  int iVar5;
  undefined4 extraout_var;
  GMM_PLATFORM_INFO *pGVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SKU_FEATURE_TABLE *pSVar7;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  GmmResourceInfoCommon *this_00;
  undefined1 local_70 [40];
  uint local_48;
  uint local_44;
  uint32_t i;
  uint32_t BitsPerPixel;
  GMM_TEXTURE_CALC *pTextureCalc;
  GMM_PLATFORM_INFO *pGStack_30;
  GMM_STATUS Status;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_RESCREATE_CUSTOM_PARAMS_2 *CreateParams_local;
  Context *GmmLibContext_local;
  GmmResourceInfoCommon *this_local;
  
  pTextureCalc._4_4_ = 1;
  _i = (GMM_TEXTURE_CALC *)0x0;
  pPlatform = (GMM_PLATFORM_INFO *)CreateParams;
  CreateParams_local = (GMM_RESCREATE_CUSTOM_PARAMS_2 *)GmmLibContext;
  GmmLibContext_local = (Context *)this;
  if (this->pClientContext == (GmmClientContext *)0x0) {
    this->ClientType = GMM_UNDEFINED_CLIENT;
  }
  else {
    GVar4 = (*this->pClientContext->_vptr_GmmClientContext[2])();
    this->ClientType = GVar4;
  }
  this->pGmmUmdLibContext = (uint64_t)CreateParams_local;
  if (this->pGmmUmdLibContext == 0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    if ((0 < (int)(pPlatform->Platform).ePCHProductFamily) &&
       ((int)(pPlatform->Platform).ePCHProductFamily < 0x181)) {
      iVar5 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
      pGVar6 = Context::GetPlatformInfo((Context *)CONCAT44(extraout_var,iVar5));
      local_44 = (uint)pGVar6->FormatTable[(pPlatform->Platform).ePCHProductFamily].Element.BitsPer;
      iVar5 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
      pGStack_30 = GmmGetPlatformInfo((GMM_LIB_CONTEXT *)CONCAT44(extraout_var_00,iVar5));
      iVar5 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
      _i = GmmGetTextureCalc((GMM_LIB_CONTEXT *)CONCAT44(extraout_var_01,iVar5));
      (this->Surf).Type = (pPlatform->Platform).eProductFamily;
      (this->Surf).Format = (pPlatform->Platform).ePCHProductFamily;
      (this->Surf).BaseWidth = *(uint64_t *)&pPlatform->Vertex;
      (this->Surf).BaseHeight = (pPlatform->Vertex).RenderPitchAlignment;
      (this->Surf).Flags.Gpu =
           *(anon_struct_8_45_9b07292e_for_Gpu *)&(pPlatform->Platform).eDisplayCoreFamily;
      (this->Surf).Flags.Info =
           *(anon_struct_8_44_94931171_for_Info *)&(pPlatform->Platform).ePlatformType;
      (this->Surf).Flags.Wa =
           *(anon_struct_4_14_9f1eeba6_for_Wa *)&(pPlatform->Platform).usDeviceID_PCH;
      (this->Surf).CachePolicy.Usage = (pPlatform->Platform).eGTType;
      (this->Surf).Pitch = (ulong)(pPlatform->Vertex).LockPitchAlignment;
      (this->Surf).Size = *(GMM_GFX_SIZE_T *)&(pPlatform->Vertex).MinPitch;
      (this->Surf).Alignment.BaseAlignment = (uint32_t)(pPlatform->Vertex).MaxPitch;
      (this->Surf).MaxLod = 1;
      (this->Surf).ArraySize = 1;
      (this->Surf).CpTag = (uint32_t)(pPlatform->Vertex).MaxHeight;
      (this->Surf).BitsPerPixel = local_44;
      (this->Surf).Alignment.QPitch = (int)(this->Surf).Pitch * (this->Surf).BaseHeight;
      GmmTextureCalc::SetTileMode(_i,&this->Surf);
      uVar3 = GmmIsPlanar((this->Surf).Format);
      if (uVar3 != '\0') {
        (*_i->_vptr_GmmTextureCalc[0x24])(_i,&this->Surf,pPlatform);
        (*this->_vptr_GmmResourceInfoCommon[0x7b])();
      }
      GVar2 = (this->Surf).Type;
      if (((((GVar2 - RESOURCE_1D < 2) || (GVar2 - RESOURCE_PRIMARY < 3)) ||
           (GVar2 - RESOURCE_NNDI < 2)) ||
          ((GVar2 == RESOURCE_OVERLAY_INTERMEDIATE_SURFACE || (GVar2 == RESOURCE_GDI)))) ||
         (GVar2 == RESOURCE_IFFS_MAPTOGTT)) {
        for (local_48 = 0; local_48 <= (this->Surf).MaxLod; local_48 = local_48 + 1) {
          puVar1 = (this->Surf).MmcHint + (ulong)local_48 * 8 + 0x80;
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
        }
        if ((((ulong)(this->Surf).Flags.Gpu >> 0x25 & 1) != 0) ||
           (((ulong)(this->Surf).Flags.Gpu >> 1 & 1) != 0)) {
          iVar5 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
          pSVar7 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_02,iVar5));
          if (((ulong)pSVar7->field_1 >> 0x12 & 1) != 0) {
            (this->AuxSurf).Flags.Gpu =
                 (anon_struct_8_45_9b07292e_for_Gpu)
                 ((ulong)(this->AuxSurf).Flags.Gpu & 0xfffff7ffffffffff | 0x80000000000);
          }
          (this->AuxSurf).Flags.Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(this->AuxSurf).Flags.Info & 0xfffffffbffffffff);
          (this->AuxSurf).Flags.Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(this->AuxSurf).Flags.Info & 0xffffffdfffffffff);
          (this->AuxSurf).Flags.Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(this->AuxSurf).Flags.Info & 0xfffffff7ffffffff);
          (this->AuxSurf).Flags.Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(this->AuxSurf).Flags.Info & 0xfffffffffff7ffff | 0x80000);
          iVar5 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
          pSVar7 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_03,iVar5));
          if ((*(ushort *)&pSVar7->field_0 >> 6 & 1) == 0) {
            (this->AuxSurf).Flags.Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(this->AuxSurf).Flags.Info & 0xffffefffffffffff);
          }
          else {
            (this->AuxSurf).Flags.Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(this->AuxSurf).Flags.Info & 0xffffffbfffffffff);
          }
          iVar5 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
          pSVar7 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_04,iVar5));
          if ((*(ushort *)&pSVar7->field_0 >> 6 & 1) == 0) {
            (this->AuxSurf).Flags.Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(this->AuxSurf).Flags.Info & 0xfffff7ffffffffff);
          }
          else {
            (this->AuxSurf).Flags.Info =
                 (anon_struct_8_44_94931171_for_Info)
                 ((ulong)(this->AuxSurf).Flags.Info & 0xffffffefffffffff);
          }
          (this->AuxSurf).ArraySize = 1;
          (this->AuxSurf).BitsPerPixel = 8;
          uVar3 = GmmIsPlanar((pPlatform->Platform).ePCHProductFamily);
          if ((uVar3 != '\0') ||
             (uVar3 = GmmIsUVPacked((pPlatform->Platform).ePCHProductFamily), uVar3 != '\0')) {
            *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x10) =
                 (ulong)(pPlatform->Index).Alignment;
            *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x30) =
                 (ulong)(pPlatform->Index).MinPitch;
            *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x18) =
                 (ulong)(pPlatform->Index).PitchAlignment;
            *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x38) =
                 (ulong)*(uint *)&(pPlatform->Index).field_0x14;
            *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x20) =
                 (ulong)(pPlatform->Index).RenderPitchAlignment;
            *(ulong *)((long)&(this->AuxSurf).OffsetInfo.field_0 + 0x40) =
                 (ulong)(uint)(pPlatform->Index).MaxPitch;
            (this->AuxSurf).OffsetInfo.field_0.Texture3DOffsetInfo.Mip0SlicePitch =
                 *(GMM_GFX_SIZE_T *)&(pPlatform->Vertex).MaxDepth;
          }
          (this->AuxSurf).Size = *(GMM_GFX_SIZE_T *)&(pPlatform->Vertex).MaxDepth;
          (this->AuxSurf).Pitch = (ulong)(uint)(pPlatform->Vertex).MaxWidth;
          (this->AuxSurf).Type = RESOURCE_BUFFER;
          memset(local_70,0,0x28);
          memcpy(&(this->AuxSurf).Alignment,local_70,0x28);
          (this->AuxSurf).Alignment.QPitch = (uint32_t)(this->AuxSurf).Size;
          (this->AuxSurf).Alignment.BaseAlignment =
               *(uint32_t *)&(pPlatform->Vertex).NeedPow2LockAlignment;
          (this->AuxSurf).Size =
               ((this->AuxSurf).Size + 0xfff) - ((this->AuxSurf).Size + 0xfff & 0xfff);
          if (((ulong)(this->AuxSurf).Flags.Gpu >> 0x23 & 1) != 0) {
            (this->AuxSurf).Alignment.BaseAlignment = 0x10000;
            (this->AuxSurf).Size =
                 ((this->AuxSurf).Size + 0xffff) - ((this->AuxSurf).Size + 0xffff & 0xffff);
          }
          (this->AuxSurf).Flags.Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(this->AuxSurf).Flags.Info & 0xffffffffdfffffff);
          (this->AuxSurf).Flags.Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(this->AuxSurf).Flags.Info & 0xffffffffffefffff);
          (this->AuxSurf).Flags.Info =
               (anon_struct_8_44_94931171_for_Info)
               ((ulong)(this->AuxSurf).Flags.Info & 0xffffffffefffffff);
          GmmTextureCalc::SetTileMode(_i,&this->AuxSurf);
          (this->AuxSurf).UnpaddedSize = (this->AuxSurf).Size;
        }
        return GMM_SUCCESS;
      }
    }
    pTextureCalc._4_4_ = GMM_INVALIDPARAM;
    this_00 = (GmmResourceInfoCommon *)GmmMemAllocator::operator_new(0x688,this);
    if (this_00 != (GmmResourceInfoCommon *)0x0) {
      GmmResourceInfoCommon(this_00);
    }
    this_local._4_4_ = pTextureCalc._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GMM_STDCALL GmmLib::GmmResourceInfoCommon::CreateCustomRes_2(Context &GmmLibContext, GMM_RESCREATE_CUSTOM_PARAMS_2 &CreateParams)
{
    const GMM_PLATFORM_INFO *pPlatform;
    GMM_STATUS               Status       = GMM_ERROR;
    GMM_TEXTURE_CALC *       pTextureCalc = NULL;
    uint32_t                 BitsPerPixel, i;


    GMM_DPF_ENTER;

    GET_GMM_CLIENT_TYPE(pClientContext, ClientType);
    pGmmUmdLibContext = reinterpret_cast<uint64_t>(&GmmLibContext);
    __GMM_ASSERTPTR(pGmmUmdLibContext, GMM_ERROR);


    if((CreateParams.Format > GMM_FORMAT_INVALID) &&
       (CreateParams.Format < GMM_RESOURCE_FORMATS))
    {
        BitsPerPixel = GetGmmLibContext()->GetPlatformInfo().FormatTable[CreateParams.Format].Element.BitsPer;
    }
    else
    {
        GMM_ASSERTDPF(0, "Format Error");
        Status = GMM_INVALIDPARAM;
        goto ERROR_CASE;
    }

    pPlatform    = GMM_OVERRIDE_PLATFORM_INFO(&Surf, GetGmmLibContext());
    pTextureCalc = GMM_OVERRIDE_TEXTURE_CALC(&Surf, GetGmmLibContext());

    Surf.Type                    = CreateParams.Type;
    Surf.Format                  = CreateParams.Format;
    Surf.BaseWidth               = CreateParams.BaseWidth64;
    Surf.BaseHeight              = CreateParams.BaseHeight;
    Surf.Flags                   = CreateParams.Flags;
    Surf.CachePolicy.Usage       = CreateParams.Usage;
    Surf.Pitch                   = CreateParams.Pitch;
    Surf.Size                    = CreateParams.Size;
    Surf.Alignment.BaseAlignment = CreateParams.BaseAlignment;
    Surf.MaxLod                  = 1;
    Surf.ArraySize               = 1;
    Surf.CpTag                   = CreateParams.CpTag;

#if(_DEBUG || _RELEASE_INTERNAL)
    Surf.Platform = GetGmmLibContext()->GetPlatformInfo().Platform;
#endif
    Surf.BitsPerPixel     = BitsPerPixel;
    Surf.Alignment.QPitch = (GMM_GLOBAL_GFX_SIZE_T)(Surf.Pitch * Surf.BaseHeight);

    pTextureCalc->SetTileMode(&Surf);

    if(GmmIsPlanar(Surf.Format))
    {
        pTextureCalc->SetPlanarOffsetInfo_2(&Surf, CreateParams);

        if(Surf.ArraySize > 1)
        {
            //Not required as this new interface doesn't support arrayed surfaces.
        }

        UpdateUnAlignedParams();
    }

    switch(Surf.Type)
    {
        case RESOURCE_1D:
        case RESOURCE_2D:
        case RESOURCE_PRIMARY:
        case RESOURCE_SHADOW:
        case RESOURCE_STAGING:
        case RESOURCE_GDI:
        case RESOURCE_NNDI:
        case RESOURCE_HARDWARE_MBM:
        case RESOURCE_OVERLAY_INTERMEDIATE_SURFACE:
        case RESOURCE_IFFS_MAPTOGTT:
#if _WIN32
        case RESOURCE_WGBOX_ENCODE_DISPLAY:
        case RESOURCE_WGBOX_ENCODE_REFERENCE:
#endif
        {
            if(Surf.ArraySize > 1)
            {
                //Not required as this new interface doesn't support arrayed surfaces.
            }

            for(i = 0; i <= Surf.MaxLod; i++)
            {
                Surf.OffsetInfo.Texture2DOffsetInfo.Offset[i] = 0;
            }

            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "GmmTexAlloc: Unknown surface type!");
            Status = GMM_INVALIDPARAM;
            goto ERROR_CASE;
            ;
        }
    };

    if(Surf.Flags.Gpu.UnifiedAuxSurface || Surf.Flags.Gpu.CCS)
    {

        if(GetGmmLibContext()->GetSkuTable().FtrLinearCCS)
        {
            AuxSurf.Flags.Gpu.__NonMsaaLinearCCS = 1;
        }

        AuxSurf.Flags.Info.TiledW  = 0;
        AuxSurf.Flags.Info.TiledYf = 0;
        AuxSurf.Flags.Info.TiledX  = 0;
        AuxSurf.Flags.Info.Linear  = 1;
        GMM_SET_64KB_TILE(AuxSurf.Flags, 0, GetGmmLibContext());
        GMM_SET_4KB_TILE(AuxSurf.Flags, 0, GetGmmLibContext());

        AuxSurf.ArraySize    = 1;
        AuxSurf.BitsPerPixel = 8;

        if(GmmIsPlanar(CreateParams.Format) || GmmIsUVPacked(CreateParams.Format))
        {
            AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_Y] = CreateParams.AuxSurf.PlaneOffset.X[GMM_PLANE_Y];
            AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_Y] = CreateParams.AuxSurf.PlaneOffset.Y[GMM_PLANE_Y];
            AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_U] = CreateParams.AuxSurf.PlaneOffset.X[GMM_PLANE_U];
            AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_U] = CreateParams.AuxSurf.PlaneOffset.Y[GMM_PLANE_U];
            AuxSurf.OffsetInfo.Plane.X[GMM_PLANE_V] = CreateParams.AuxSurf.PlaneOffset.X[GMM_PLANE_V];
            AuxSurf.OffsetInfo.Plane.Y[GMM_PLANE_V] = CreateParams.AuxSurf.PlaneOffset.Y[GMM_PLANE_V];
            AuxSurf.OffsetInfo.Plane.ArrayQPitch    = CreateParams.AuxSurf.Size;
        }

        AuxSurf.Size = CreateParams.AuxSurf.Size;

        AuxSurf.Pitch     = CreateParams.AuxSurf.Pitch;
        AuxSurf.Type      = RESOURCE_BUFFER;
        AuxSurf.Alignment = {0};

        AuxSurf.Alignment.QPitch        = GFX_ULONG_CAST(AuxSurf.Size);
        AuxSurf.Alignment.BaseAlignment = CreateParams.AuxSurf.BaseAlignment; //TODO: TiledResource?
        AuxSurf.Size                    = GFX_ALIGN(AuxSurf.Size, PAGE_SIZE); //page-align final size

        if(AuxSurf.Flags.Gpu.TiledResource)
        {
            AuxSurf.Alignment.BaseAlignment = GMM_KBYTE(64);                          //TODO: TiledResource?
            AuxSurf.Size                    = GFX_ALIGN(AuxSurf.Size, GMM_KBYTE(64)); //page-align final size
        }

        //Clear compression request in CCS
        AuxSurf.Flags.Info.RenderCompressed = 0;
        AuxSurf.Flags.Info.MediaCompressed  = 0;
        AuxSurf.Flags.Info.RedecribedPlanes = 0;
        pTextureCalc->SetTileMode(&AuxSurf);
        AuxSurf.UnpaddedSize = AuxSurf.Size;
    }
    GMM_DPF_EXIT;
    return GMM_SUCCESS;

ERROR_CASE:
    //Zero out all the members
    new(this) GmmResourceInfoCommon();

    GMM_DPF_EXIT;
    return Status;
}